

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

bool __thiscall
libtorrent::aux::session_impl::on_dht_request
          (session_impl *this,string_view query,msg *request,entry *response)

{
  pointer psVar1;
  pointer psVar2;
  element_type *peVar3;
  int iVar4;
  pointer psVar5;
  
  psVar1 = (this->m_ses_extensions)._M_elems[3].
           super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->m_ses_extensions)._M_elems[3].
           super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar1 != psVar2) {
    do {
      psVar5 = psVar1 + 1;
      peVar3 = (psVar1->super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      iVar4 = (*peVar3->_vptr_plugin[6])
                        (peVar3,query._M_len,query._M_str,&request->addr,request->message,response);
      if ((char)iVar4 != '\0') {
        return (bool)(char)iVar4;
      }
      psVar1 = psVar5;
    } while (psVar5 != psVar2);
  }
  return false;
}

Assistant:

bool session_impl::on_dht_request(string_view query
		, dht::msg const& request, entry& response)
	{
#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& ext : m_ses_extensions[plugins_dht_request_idx])
		{
			if (ext->on_dht_request(query
				, request.addr, request.message, response))
				return true;
		}
#else
		TORRENT_UNUSED(query);
		TORRENT_UNUSED(request);
		TORRENT_UNUSED(response);
#endif
		return false;
	}